

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall
wallet::CWallet::CommitTransaction
          (CWallet *this,CTransactionRef tx,mapValue_t mapValue,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          orderForm)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  CWalletTx *wtx;
  mapped_type *pmVar4;
  runtime_error *this_00;
  char *in_RCX;
  element_type *peVar5;
  CTxIn *txin;
  pointer __k;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  string_view str;
  string_view suffix;
  undefined1 in_stack_ffffffffffffff48;
  allocator<char> local_a9 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  undefined1 local_88 [16];
  code *local_78;
  code *local_70;
  string err_string;
  
  peVar5 = tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock49,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x90e,false);
  CTransaction::ToString_abi_cxx11_
            (&err_string,
             (CTransaction *)
             (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start);
  str._M_str = err_string._M_dataplus._M_p;
  str._M_len = err_string._M_string_length;
  suffix._M_str = "\n";
  suffix._M_len = 1;
  local_88 = (undefined1  [16])util::RemoveSuffixView(str,suffix);
  WalletLogPrintf<std::basic_string_view<char,std::char_traits<char>>>
            (this,(ConstevalFormatString<1U>)0x3de8ad,
             (basic_string_view<char,_std::char_traits<char>_> *)local_88);
  std::__cxx11::string::~string((string *)&err_string);
  std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)(local_a9 + 1),
             (__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)peVar5);
  err_string._M_dataplus._M_p = err_string._M_dataplus._M_p & 0xffffffffffffff00;
  local_88._8_8_ = in_RCX;
  local_88._0_8_ =
       tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
  ;
  local_70 = std::
             _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(wallet::CWalletTx_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp:2323:57)>
             ::_M_manager;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&err_string;
  tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(local_a9 + 1);
  wtx = AddToWallet(this,tx_00,(TxState *)local_88,(UpdateWalletTxFn *)0x1,false,
                    (bool)in_stack_ffffffffffffff48);
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  if (wtx == (CWalletTx *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"CommitTransaction",local_a9);
    std::operator+(&err_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                   ": Wallet db error, transaction commit failed");
    std::runtime_error::runtime_error(this_00,(string *)&err_string);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    peVar5 = (element_type *)
             (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar2 = (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (__k = (peVar5->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start; __k != pCVar2; __k = __k + 1) {
      pmVar4 = std::__detail::
               _Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&this->mapWallet,(key_type *)__k);
      pmVar4->m_amounts[0].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pmVar4->m_amounts[1].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pmVar4->m_amounts[2].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pmVar4->m_amounts[3].m_cached.super__Base_bitset<1UL>._M_w = 0;
      pmVar4->m_is_cache_empty = true;
      pmVar4->fChangeCached = false;
      boost::signals2::
      signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
      ::operator()(&this->NotifyTransactionChanged,
                   &(((pmVar4->tx).
                      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    hash).m_wrapped,CT_UPDATED);
    }
    if (this->fBroadcastTransactions != false) {
      err_string._M_dataplus._M_p = (pointer)&err_string.field_2;
      err_string._M_string_length = 0;
      err_string.field_2._M_local_buf[0] = '\0';
      bVar3 = SubmitTxMemoryPoolAndRelay(this,wtx,&err_string,true);
      if (!bVar3) {
        WalletLogPrintf<std::__cxx11::string>(this,(ConstevalFormatString<1U>)0x3de903,&err_string);
      }
      std::__cxx11::string::~string((string *)&err_string);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock49.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::CommitTransaction(CTransactionRef tx, mapValue_t mapValue, std::vector<std::pair<std::string, std::string>> orderForm)
{
    LOCK(cs_wallet);
    WalletLogPrintf("CommitTransaction:\n%s\n", util::RemoveSuffixView(tx->ToString(), "\n"));

    // Add tx to wallet, because if it has change it's also ours,
    // otherwise just for transaction history.
    CWalletTx* wtx = AddToWallet(tx, TxStateInactive{}, [&](CWalletTx& wtx, bool new_tx) {
        CHECK_NONFATAL(wtx.mapValue.empty());
        CHECK_NONFATAL(wtx.vOrderForm.empty());
        wtx.mapValue = std::move(mapValue);
        wtx.vOrderForm = std::move(orderForm);
        wtx.fTimeReceivedIsTxTime = true;
        wtx.fFromMe = true;
        return true;
    });

    // wtx can only be null if the db write failed.
    if (!wtx) {
        throw std::runtime_error(std::string(__func__) + ": Wallet db error, transaction commit failed");
    }

    // Notify that old coins are spent
    for (const CTxIn& txin : tx->vin) {
        CWalletTx &coin = mapWallet.at(txin.prevout.hash);
        coin.MarkDirty();
        NotifyTransactionChanged(coin.GetHash(), CT_UPDATED);
    }

    if (!fBroadcastTransactions) {
        // Don't submit tx to the mempool
        return;
    }

    std::string err_string;
    if (!SubmitTxMemoryPoolAndRelay(*wtx, err_string, true)) {
        WalletLogPrintf("CommitTransaction(): Transaction cannot be broadcast immediately, %s\n", err_string);
        // TODO: if we expect the failure to be long term or permanent, instead delete wtx from the wallet and return failure.
    }
}